

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O2

task_priority __thiscall
oqpi::scheduler<concurrent_queue>::resolveTaskPriority
          (scheduler<concurrent_queue> *this,task_handle *hTask)

{
  element_type *peVar1;
  task_priority tVar2;
  bool bVar3;
  task_group_sptr *ptVar4;
  uint64_t uVar5;
  
  tVar2 = task_handle::getPriority(hTask);
  if (tVar2 == inherit) {
    ptVar4 = task_handle::getParentGroup(hTask);
    do {
      peVar1 = (ptVar4->super___shared_ptr<oqpi::task_group_base,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (peVar1 == (element_type *)0x0) {
        uVar5 = task_handle::getUID(hTask);
        bVar3 = assert_and_return_true
                          ("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/scheduler.hpp"
                           ,0xd6,"pParentGroup != nullptr",
                           "One parent group is invalid for this task: %d",uVar5);
        if (bVar3) {
          return normal;
        }
      }
      tVar2 = (peVar1->super_task_base).priority_;
      ptVar4 = &(peVar1->super_task_base).spParentGroup_;
    } while (tVar2 == inherit);
  }
  return tVar2;
}

Assistant:

task_priority resolveTaskPriority(const task_handle &hTask)
        {
            task_priority priority = hTask.getPriority();

            if (priority == task_priority::inherit)
            {
                auto pParentGroup = hTask.getParentGroup().get();
                do 
                {
                    if (oqpi_failedf(pParentGroup != nullptr, "One parent group is invalid for this task: %d", hTask.getUID()))
                    {
                         priority = task_priority::normal;
                        break;
                    }

                    priority     = pParentGroup->getPriority();
                    pParentGroup = pParentGroup->getParentGroup().get();

                } while (priority == task_priority::inherit);
            }

            return priority;
        }